

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

pair<QEventPoint::State,_QList<QEventPoint>_> * __thiscall
QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::operator[]
          (QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *this,QWidget **key
          )

{
  pair<QEventPoint::State,_QList<QEventPoint>_> *ppVar1;
  long in_FS_OFFSET;
  QWidget **in_stack_ffffffffffffffb8;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppVar1 = iterator::operator*((iterator *)0x2dac53);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }